

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double * normal_samples(int n,double mu,double sigma,int *seed)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  
  pdVar1 = normal_01_samples(n,seed);
  uVar2 = 0;
  uVar3 = (ulong)(uint)n;
  if (n < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    pdVar1[uVar2] = pdVar1[uVar2] * sigma + mu;
  }
  return pdVar1;
}

Assistant:

double *normal_samples ( int n, double mu, double sigma, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    NORMAL_SAMPLES returns multiple samples of the Normal PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    26 September 2018
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of samples.
//
//    Input, double MU, SIGMA, the mean and standard deviation.
//    SIGMA should not be zero.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double NORMAL_SAMPLES[N], the samples.
//
{
  int i;
  double *x;

  x = normal_01_samples ( n, seed );

  for ( i = 0; i < n; i++ )
  {
    x[i] = mu + sigma * x[i];
  }

  return x;
}